

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

char * fmt::v10::detail::parse_dynamic_spec<char>
                 (char *begin,char *end,int *value,arg_ref<char> *ref,
                 basic_format_parse_context<char> *ctx)

{
  int iVar1;
  dynamic_spec_id_handler<char> handler;
  char *local_28;
  dynamic_spec_id_handler<char> local_20;
  
  local_28 = begin;
  if (begin == end) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/fmt/include/fmt/core.h"
                ,0x8c3,"");
  }
  if ((byte)(*begin - 0x30U) < 10) {
    iVar1 = parse_nonnegative_int<char>(&local_28,end,-1);
    if (iVar1 == -1) {
      throw_format_error("number is too big");
    }
    *value = iVar1;
  }
  else if (*begin == '{') {
    local_28 = begin + 1;
    local_20.ctx = ctx;
    local_20.ref = ref;
    if (local_28 != end) {
      if ((*local_28 == ':') || (*local_28 == '}')) {
        iVar1 = ctx->next_arg_id_;
        if (iVar1 < 0) {
          throw_format_error("cannot switch from manual to automatic argument indexing");
        }
        ctx->next_arg_id_ = iVar1 + 1;
        ref->kind = index;
        (ref->val).index = iVar1;
      }
      else {
        local_28 = do_parse_arg_id<char,fmt::v10::detail::dynamic_spec_id_handler<char>&>
                             (local_28,end,&local_20);
      }
    }
    if ((local_28 == end) || (*local_28 != '}')) {
      throw_format_error("invalid format string");
    }
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

FMT_CONSTEXPR auto parse_dynamic_spec(const Char* begin, const Char* end,
                                      int& value, arg_ref<Char>& ref,
                                      basic_format_parse_context<Char>& ctx)
    -> const Char* {
  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    int val = parse_nonnegative_int(begin, end, -1);
    if (val != -1)
      value = val;
    else
      throw_format_error("number is too big");
  } else if (*begin == '{') {
    ++begin;
    auto handler = dynamic_spec_id_handler<Char>{ctx, ref};
    if (begin != end) begin = parse_arg_id(begin, end, handler);
    if (begin != end && *begin == '}') return ++begin;
    throw_format_error("invalid format string");
  }
  return begin;
}